

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

int absl::synchronization_internal::MutexDelay(int32_t c,int mode)

{
  MutexGlobals *pMVar1;
  Duration DVar2;
  Duration duration;
  ScopedEnable local_18;
  int local_14;
  ScopedEnable enable_rescheduling;
  int32_t limit;
  int mode_local;
  int32_t c_local;
  
  enable_rescheduling.scheduling_disabled_depth_ = mode;
  pMVar1 = anon_unknown_11::GetMutexGlobals();
  local_14 = pMVar1->mutex_sleep_limit[enable_rescheduling.scheduling_disabled_depth_];
  if (c < local_14) {
    limit = c + 1;
  }
  else {
    base_internal::SchedulingGuard::ScopedEnable::ScopedEnable(&local_18);
    if (c == local_14) {
      AbslInternalMutexYield();
      limit = c + 1;
    }
    else {
      DVar2 = Microseconds<int,_0>(10);
      duration._8_8_ = DVar2._8_8_;
      duration.rep_hi_ = (ulong)DVar2.rep_lo_;
      SleepFor((absl *)DVar2.rep_hi_,duration);
      limit = 0;
    }
    base_internal::SchedulingGuard::ScopedEnable::~ScopedEnable(&local_18);
  }
  return limit;
}

Assistant:

int MutexDelay(int32_t c, int mode) {
  const int32_t limit = GetMutexGlobals().mutex_sleep_limit[mode];
  if (c < limit) {
    // Spin.
    c++;
  } else {
    SchedulingGuard::ScopedEnable enable_rescheduling;
    ABSL_TSAN_MUTEX_PRE_DIVERT(nullptr, 0);
    if (c == limit) {
      // Yield once.
      ABSL_INTERNAL_C_SYMBOL(AbslInternalMutexYield)();
      c++;
    } else {
      // Then wait.
      absl::SleepFor(absl::Microseconds(10));
      c = 0;
    }
    ABSL_TSAN_MUTEX_POST_DIVERT(nullptr, 0);
  }
  return c;
}